

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O2

bool __thiscall
EnrichableAnalyzerSubprocess::GetFeatureEnablement(EnrichableAnalyzerSubprocess *this,char *feature)

{
  int iVar1;
  char result [16];
  string value;
  string local_1d0 [32];
  stringstream outputStream;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStream);
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::operator<<(local_1a0,"feature");
  std::operator<<(local_1a0,'\t');
  std::operator<<(local_1a0,feature);
  std::operator<<(local_1a0,'\n');
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&value,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  GetScriptResponse(this,value._M_dataplus._M_p,(uint)value._M_string_length,result,0x10);
  iVar1 = bcmp(result,"no",3);
  if (iVar1 == 0) {
    std::operator<<((ostream *)&std::cerr,"message type \"");
    std::operator<<((ostream *)&std::cerr,feature);
    std::operator<<((ostream *)&std::cerr,"\" disabled\n");
  }
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStream);
  return iVar1 != 0;
}

Assistant:

bool EnrichableAnalyzerSubprocess::GetFeatureEnablement(const char* feature) {
	std::stringstream outputStream;
	char result[16];
	std::string value;

	outputStream << FEATURE_PREFIX;
	outputStream << UNIT_SEPARATOR;
	outputStream << feature;
	outputStream << LINE_SEPARATOR;
	value = outputStream.str();

	GetScriptResponse(
		value.c_str(),
		value.length(),
		result,
		16
	);
	if(strcmp(result, "no") == 0) {
		std::cerr << "message type \"";
		std::cerr << feature;
		std::cerr << "\" disabled\n";
		return false;
	}
	return true;
}